

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O0

void __thiscall DSDcc::DSDdPMR::processColourCode(DSDdPMR *this,int symbolIndex,int dibit)

{
  byte bVar1;
  DSDLogger *this_00;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  double __x;
  int n;
  int i;
  int local_14;
  
  *(bool *)((long)in_RDI + (long)in_ESI + 0x28) = 1 < in_EDX;
  if (in_ESI == 0xb) {
    *(undefined4 *)(in_RDI + 8) = 0;
    bVar1 = 0;
    for (local_14 = 0xb; -1 < local_14; local_14 = local_14 + -1) {
      if (*(char *)((long)in_RDI + (long)local_14 + 0x28) == '\x01') {
        *(int *)(in_RDI + 8) = (1 << (bVar1 & 0x1f)) + *(int *)(in_RDI + 8);
      }
      bVar1 = bVar1 + 1;
    }
    this_00 = DSDDecoder::getLogger((DSDDecoder *)*in_RDI);
    DSDLogger::log(this_00,__x);
  }
  return;
}

Assistant:

void DSDdPMR::processColourCode(int symbolIndex, int dibit)
{
    m_colourBuffer[symbolIndex] = (dibit > 1 ? 1 : 0); // 01->0, 11->1 with 00 and 01 on the same positive side and 10 and 11 on the same negative side

    if (symbolIndex == 11) // last symbol
    {
        m_colourCode = 0;

        for (int i = 11, n = 0; i >= 0; i--, n++) // colour code is stored MSB first
        {
            if (m_colourBuffer[i] == 1)
            {
                m_colourCode += (1<<n); // bit is 1
            }
        }

        m_dsdDecoder->getLogger().log("DSDdPMR::processColourCode: %d\n", m_colourCode); // DEBUG
    }
}